

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_key_share(ptls_key_exchange_algorithm_t **selected,ptls_iovec_t *peer_key,
                    ptls_key_exchange_algorithm_t **candidates,uint8_t **src,uint8_t *end,
                    int expect_one)

{
  int iVar1;
  ptls_key_exchange_algorithm_t **local_58;
  ptls_key_exchange_algorithm_t **c;
  ptls_iovec_t key;
  int local_38;
  uint16_t group;
  int ret;
  int expect_one_local;
  uint8_t *end_local;
  uint8_t **src_local;
  ptls_key_exchange_algorithm_t **candidates_local;
  ptls_iovec_t *peer_key_local;
  ptls_key_exchange_algorithm_t **selected_local;
  
  *selected = (ptls_key_exchange_algorithm_t *)0x0;
  if ((expect_one == 0) || (*src != end)) {
    do {
      if (*src == end) {
        return 0;
      }
      iVar1 = decode_key_share_entry((uint16_t *)((long)&key.len + 6),(ptls_iovec_t *)&c,src,end);
      local_58 = candidates;
      if (iVar1 != 0) {
        return iVar1;
      }
      for (; *local_58 != (ptls_key_exchange_algorithm_t *)0x0; local_58 = local_58 + 1) {
        if ((*selected == (ptls_key_exchange_algorithm_t *)0x0) &&
           ((*local_58)->id == key.len._6_2_)) {
          *selected = *local_58;
          peer_key->base = (uint8_t *)c;
          peer_key->len = (size_t)key.base;
        }
      }
    } while (expect_one == 0);
    local_38 = 0x2f;
    if (*selected != (ptls_key_exchange_algorithm_t *)0x0) {
      local_38 = 0;
    }
  }
  else {
    local_38 = 0x2f;
  }
  return local_38;
}

Assistant:

static int select_key_share(ptls_key_exchange_algorithm_t **selected, ptls_iovec_t *peer_key,
                            ptls_key_exchange_algorithm_t **candidates, const uint8_t **src, const uint8_t *const end,
                            int expect_one)
{
    int ret;

    *selected = NULL;

    if (expect_one && *src == end) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    while (*src != end) {
        uint16_t group;
        ptls_iovec_t key;
        if ((ret = decode_key_share_entry(&group, &key, src, end)) != 0)
            goto Exit;
        ptls_key_exchange_algorithm_t **c = candidates;
        for (; *c != NULL; ++c) {
            if (*selected == NULL && (*c)->id == group) {
                *selected = *c;
                *peer_key = key;
            }
        }
        if (expect_one) {
            ret = *selected != NULL ? 0 : PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    return ret;
}